

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pathtracer.cpp
# Opt level: O3

void __thiscall CGL::PathTracer::~PathTracer(PathTracer *this)

{
  pointer pVVar1;
  pointer pVVar2;
  pointer piVar3;
  
  if (this->gridSampler != (Sampler2D *)0x0) {
    (*this->gridSampler->_vptr_Sampler2D[1])();
  }
  if (this->hemisphereSampler != (Sampler3D *)0x0) {
    (*this->hemisphereSampler->_vptr_Sampler3D[1])();
  }
  pVVar1 = (this->flare_radiance).super__Vector_base<CGL::Vector3D,_std::allocator<CGL::Vector3D>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pVVar1 != (pointer)0x0) {
    operator_delete(pVVar1);
  }
  pVVar2 = (this->flare_origins).super__Vector_base<CGL::Vector2D,_std::allocator<CGL::Vector2D>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pVVar2 != (pointer)0x0) {
    operator_delete(pVVar2);
  }
  piVar3 = (this->sampleCountBuffer).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar3 != (pointer)0x0) {
    operator_delete(piVar3);
  }
  pVVar1 = (this->sampleBuffer).data.
           super__Vector_base<CGL::Vector3D,_std::allocator<CGL::Vector3D>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pVVar1 != (pointer)0x0) {
    operator_delete(pVVar1);
  }
  pVVar1 = (this->ghost_buffer).data.
           super__Vector_base<CGL::Vector3D,_std::allocator<CGL::Vector3D>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pVVar1 != (pointer)0x0) {
    operator_delete(pVVar1);
    return;
  }
  return;
}

Assistant:

PathTracer::~PathTracer() {
  delete gridSampler;
  delete hemisphereSampler;
}